

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O0

void __thiscall
chrono::ChArchiveExplorer::out
          (ChArchiveExplorer *this,
          ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *bVal)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference token;
  char *pcVar4;
  ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *mvalp;
  char *pcVar5;
  ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *bVal_local;
  ChArchiveExplorer *this_local;
  
  if (((this->found & 1U) == 0) &&
     (iVar1 = this->tablevel, local_18 = bVal,
     bVal_local = (ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this,
     sVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&this->search_tokens), (long)iVar1 == sVar3 - 1)) {
    token = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->search_tokens,(long)this->tablevel);
    pcVar4 = ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::name(bVal);
    bVar2 = MatchName(this,token,pcVar4);
    if (bVar2) {
      this_00 = (ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)operator_new(0x38);
      mvalp = ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::value(bVal);
      pcVar4 = ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::name(bVal);
      pcVar5 = ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::flags(bVal);
      ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::ChValueSpecific(this_00,mvalp,pcVar4,*pcVar5);
      local_20 = this_00;
      std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::push_back
                (&this->results,(value_type *)&local_20);
      this->found = true;
    }
  }
  return;
}

Assistant:

virtual void out     (ChNameValue<std::string> bVal){
            if (this->found) return;
            if (this->tablevel != this->search_tokens.size()-1) return;
            if (this->MatchName(search_tokens[this->tablevel],bVal.name())) {
                this->results.push_back(new ChValueSpecific<std::string>(bVal.value(),bVal.name(),bVal.flags()));
                this->found = true;
            }
      }